

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringComparison.h
# Opt level: O0

uint Assimp::ASSIMP_itoa10(char *out,uint max,int32_t number)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint digit;
  uint uStack_1c;
  bool mustPrint;
  int32_t cur;
  uint written;
  int32_t number_local;
  uint max_local;
  char *out_local;
  
  if (out == (char *)0x0) {
    __assert_fail("__null != out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                  ,0x53,"unsigned int Assimp::ASSIMP_itoa10(char *, unsigned int, int32_t)");
  }
  uStack_1c = 1;
  cur = number;
  _number_local = out;
  if ((number < 0) && (1 < max)) {
    _number_local = out + 1;
    *out = '-';
    uStack_1c = 2;
    cur = -number;
  }
  digit = 1000000000;
  bVar1 = false;
  while (uStack_1c < max) {
    iVar2 = cur / (int)digit;
    if (((bVar1) || (iVar2 != 0)) || (digit == 1)) {
      bVar1 = true;
      pcVar3 = _number_local + 1;
      *_number_local = (char)iVar2 + '0';
      uStack_1c = uStack_1c + 1;
      cur = cur - iVar2 * digit;
      _number_local = pcVar3;
      if (digit == 1) break;
    }
    digit = (int)digit / 10;
  }
  *_number_local = '\0';
  return uStack_1c - 1;
}

Assistant:

AI_FORCE_INLINE
unsigned int ASSIMP_itoa10( char* out, unsigned int max, int32_t number) {
    ai_assert(NULL != out);

    // write the unary minus to indicate we have a negative number
    unsigned int written = 1u;
    if (number < 0 && written < max)    {
        *out++ = '-';
        ++written;
        number = -number;
    }

    // We begin with the largest number that is not zero.
    int32_t cur = 1000000000; // 2147483648
    bool mustPrint = false;
    while (written < max)   {

        const unsigned int digit = number / cur;
        if (mustPrint || digit > 0 || 1 == cur) {
            // print all future zeroe's from now
            mustPrint = true;

            *out++ = '0'+static_cast<char>(digit);

            ++written;
            number -= digit*cur;
            if (1 == cur) {
                break;
            }
        }
        cur /= 10;
    }

    // append a terminal zero
    *out++ = '\0';
    return written-1;
}